

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O1

int __thiscall
Clasp::Cli::TextOutput::printChildKey(TextOutput *this,uint level,char *key,uint32 idx,char *pre)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = level * 2;
  printf("%s%-*.*s",this->format[0],(ulong)uVar1,(ulong)uVar1," ");
  if (key == (char *)0x0) {
    if (pre == (char *)0x0) {
      iVar2 = printf("[%u]",(ulong)idx);
    }
    else {
      iVar2 = printf("[%s %u]",pre,(ulong)idx);
    }
  }
  else {
    iVar2 = printf("%s",key);
  }
  return this->width_ - (iVar2 + uVar1);
}

Assistant:

int TextOutput::printChildKey(unsigned level, const char* key, uint32 idx, const char* pre) const {
	const unsigned indent = level * 2;
	int len = 0;
	printf("%s%-*.*s", format[cat_comment], indent, indent, " ");
	if      (key) { len = printf("%s", key); }
	else if (pre) { len = printf("[%s %u]", pre, idx); }
	else          { len = printf("[%u]", idx); }
	return (width_ - (int)indent) - len;
}